

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O2

void __thiscall
hwtest::pgraph::MthdRankineTxcEnable::~MthdRankineTxcEnable(MthdRankineTxcEnable *this)

{
  pgraph::SingleMthdTest::~SingleMthdTest(&this->super_SingleMthdTest);
  operator_delete(this);
  return;
}

Assistant:

void adjust_orig_mthd() override {
		adjust_orig_xf(&orig);
		if (rnd() & 1) {
			val &= 0xff;
			if (rnd() & 1) {
				val |= 1 << (rnd() & 0x1f);
				if (rnd() & 1) {
					val |= 1 << (rnd() & 0x1f);
				}
			}
		}
	}